

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultsummary.cpp
# Opt level: O3

void __thiscall trun::ResultSummary::AddResult(ResultSummary *this,Ref *tfunc)

{
  element_type *peVar1;
  int iVar2;
  undefined8 uVar3;
  Ref result;
  value_type local_28;
  
  peVar1 = (tfunc->super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
    ::push_back(&this->testFunctions,tfunc);
    std::
    vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
    push_back(&this->results,&local_28);
    this->testsExecuted = this->testsExecuted + 1;
    if ((local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        testResult != kTestResult_Pass) {
      this->testsFailed = this->testsFailed + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    if (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  if (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void ResultSummary::AddResult(const TestFunc::Ref tfunc) {
    auto result = tfunc->Result();

#ifdef TRUN_HAVE_THREADS
    std::lock_guard<std::mutex> guard(lock);
#endif

    testFunctions.push_back(tfunc);
    results.push_back(result);

    testsExecuted++;
    if (result->Result() != kTestResult_Pass) {
        testsFailed++;
    }
}